

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_PackedExtensions_Test::TestBody
          (GeneratedMessageReflectionTest_PackedExtensions_Test *this)

{
  Metadata MVar1;
  TestPackedExtensions message;
  ReflectionTester reflection_tester;
  TestPackedExtensions TStack_b8;
  ReflectionTester local_88;
  
  proto2_unittest::TestPackedExtensions::TestPackedExtensions(&TStack_b8,(Arena *)0x0);
  TestUtil::SetPackedExtensions<proto2_unittest::TestPackedExtensions>(&TStack_b8);
  TestUtil::ExpectPackedExtensionsSet<proto2_unittest::TestPackedExtensions>(&TStack_b8);
  proto2_unittest::TestPackedExtensions::Clear(&TStack_b8);
  MVar1 = proto2_unittest::TestPackedExtensions::GetMetadata
                    ((TestPackedExtensions *)
                     proto2_unittest::_TestPackedExtensions_default_instance_);
  TestUtil::ReflectionTester::ReflectionTester(&local_88,MVar1.descriptor);
  TestUtil::ReflectionTester::SetPackedFieldsViaReflection(&local_88,&TStack_b8.super_Message);
  TestUtil::ExpectPackedExtensionsSet<proto2_unittest::TestPackedExtensions>(&TStack_b8);
  TestUtil::ReflectionTester::ExpectPackedFieldsSetViaReflection(&local_88,&TStack_b8.super_Message)
  ;
  proto2_unittest::TestPackedExtensions::~TestPackedExtensions(&TStack_b8);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, PackedExtensions) {
  // Set every extension to a unique value then go back and check all those
  // values.
  unittest::TestPackedExtensions message;

  // First set the extensions via the generated API (see b/366468123).
  TestUtil::SetPackedExtensions(&message);
  TestUtil::ExpectPackedExtensionsSet(message);
  message.Clear();

  TestUtil::ReflectionTester reflection_tester(
      unittest::TestPackedExtensions::descriptor());

  reflection_tester.SetPackedFieldsViaReflection(&message);
  TestUtil::ExpectPackedExtensionsSet(message);
  reflection_tester.ExpectPackedFieldsSetViaReflection(message);
}